

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O0

ValueIterator * __thiscall
llvm::iterator_range<llvm::DWARFDebugNames::ValueIterator>::begin
          (ValueIterator *__return_storage_ptr__,
          iterator_range<llvm::DWARFDebugNames::ValueIterator> *this)

{
  iterator_range<llvm::DWARFDebugNames::ValueIterator> *this_local;
  
  DWARFDebugNames::ValueIterator::ValueIterator(__return_storage_ptr__,&this->begin_iterator);
  return __return_storage_ptr__;
}

Assistant:

IteratorT begin() const { return begin_iterator; }